

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileimagewindow.cc
# Opt level: O0

void __thiscall bgui::FileImageWindow::updateTitle(FileImageWindow *this)

{
  int iVar1;
  reference pvVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  BaseWindow *this_00;
  ostream *poVar4;
  ImageWindow *in_RDI;
  string name;
  ostringstream os;
  ImageAdapterBase *adapt;
  char *in_stack_fffffffffffffda8;
  BaseWindow *in_stack_fffffffffffffdb0;
  undefined8 in_stack_fffffffffffffdf0;
  undefined1 size_max;
  undefined8 in_stack_fffffffffffffdf8;
  ImageAdapterBase *in_stack_fffffffffffffe08;
  ImageWindow *in_stack_fffffffffffffe10;
  string local_1d8 [48];
  string local_1a8 [32];
  ostringstream local_188 [376];
  ImageAdapterBase *local_10;
  
  size_max = (undefined1)((ulong)in_stack_fffffffffffffdf0 >> 0x38);
  local_10 = ImageWindow::getAdapter(in_RDI);
  if (local_10 == (ImageAdapterBase *)0x0) {
    ImageWindow::setAdapter
              (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,SUB81((ulong)in_RDI >> 0x38,0),
               (keep)in_RDI,(int)((ulong)in_stack_fffffffffffffdf8 >> 0x20),
               (int)in_stack_fffffffffffffdf8,(bool)size_max);
    BaseWindow::setTitle(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    BaseWindow::setInfoText(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_188);
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&in_RDI[1].helptext,(ulong)*(uint *)&in_RDI[1].field_0x38);
    std::__cxx11::string::string(local_1a8,(string *)pvVar2);
    poVar3 = std::operator<<((ostream *)local_188,local_1a8);
    poVar3 = std::operator<<(poVar3," - ");
    iVar1 = (*local_10->_vptr_ImageAdapterBase[5])();
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,CONCAT44(extraout_var,iVar1));
    poVar3 = std::operator<<(poVar3,"x");
    iVar1 = (*local_10->_vptr_ImageAdapterBase[6])();
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,CONCAT44(extraout_var_00,iVar1));
    poVar3 = std::operator<<(poVar3,"x");
    iVar1 = (*local_10->_vptr_ImageAdapterBase[7])();
    this_00 = (BaseWindow *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<((ostream *)this_00," ");
    (*local_10->_vptr_ImageAdapterBase[8])(local_1d8);
    std::operator<<(poVar3,local_1d8);
    std::__cxx11::string::~string(local_1d8);
    if (((in_RDI[2].field_0x1c & 1) != 0) || (*(int *)&in_RDI[2].adapt != 0)) {
      std::operator<<((ostream *)local_188," -");
      if ((in_RDI[2].field_0x1c & 1) != 0) {
        poVar4 = std::operator<<((ostream *)local_188," ");
        std::operator<<(poVar4,"watch");
      }
      if (*(int *)&in_RDI[2].adapt == 1) {
        poVar4 = std::operator<<((ostream *)local_188," ");
        std::operator<<(poVar4,"keep");
      }
      if (*(int *)&in_RDI[2].adapt == 2) {
        poVar4 = std::operator<<((ostream *)local_188," ");
        std::operator<<(poVar4,"keep_all");
      }
    }
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::c_str();
    BaseWindow::setTitle(this_00,(char *)poVar3);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe08);
    std::__cxx11::string::~string(local_1a8);
    std::__cxx11::ostringstream::~ostringstream(local_188);
  }
  return;
}

Assistant:

void FileImageWindow::updateTitle()
{
  ImageAdapterBase *adapt=getAdapter();

  // set image adapter and title

  if (adapt != 0)
  {
    std::ostringstream os;

    std::string name=list[current];

    os << name << " - " << adapt->getOriginalWidth() << "x" <<
       adapt->getOriginalHeight() << "x" << adapt->getOriginalDepth() <<
       " " << adapt->getOriginalType();

    if (watch_file || kp != keep_none)
    {
      os << " -";

      if (watch_file)
      {
        os << " " << "watch";
      }

      if (kp == keep_most)
      {
        os << " " << "keep";
      }

      if (kp == keep_all)
      {
        os << " " << "keep_all";
      }
    }

    setTitle(os.str().c_str());
  }
  else
  {
    setAdapter(0);
    setTitle("Image");
    setInfoText("No image!");
  }
}